

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::FieldBase::FieldBase(FieldBase *this,FieldBase *rhs)

{
  this->_vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011b4e0;
  this->m_tag = rhs->m_tag;
  std::__cxx11::string::string((string *)&this->m_string,(string *)&rhs->m_string);
  (this->m_data)._M_dataplus._M_p = (pointer)&(this->m_data).field_2;
  (this->m_data)._M_string_length = 0;
  (this->m_data).field_2._M_local_buf[0] = '\0';
  this->m_metrics = rhs->m_metrics;
  return;
}

Assistant:

FieldBase(const FieldBase &rhs)
      : m_tag(rhs.getTag()),
        m_string(rhs.m_string),
        m_metrics(rhs.m_metrics) {}